

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

void labpack_reader_end(labpack_reader_t *reader)

{
  mpack_error_t mVar1;
  char *pcVar2;
  labpack_reader_t *reader_local;
  
  if (reader != (labpack_reader_t *)0x0) {
    mVar1 = mpack_reader_destroy(reader->decoder);
    if (mVar1 != mpack_ok) {
      reader->status = LABPACK_STATUS_ERROR_DECODER;
      mVar1 = mpack_reader_error(reader->decoder);
      pcVar2 = mpack_error_to_string(mVar1);
      reader->status_message = pcVar2;
    }
    return;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x8a,"void labpack_reader_end(labpack_reader_t *)");
}

Assistant:

void
labpack_reader_end(labpack_reader_t* reader)
{
    assert(reader);
    if (mpack_reader_destroy(reader->decoder) != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        reader->status_message = mpack_error_to_string(mpack_reader_error(reader->decoder));
    }
}